

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandFraigClean(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  
  Extra_UtilGetoptReset();
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"dh");
  } while (iVar1 == 100);
  if (iVar1 != -1) {
    Abc_Print(-2,"usage: fraig_clean [-h]\n");
    Abc_Print(-2,"\t        cleans the internal FRAIG storage\n");
    Abc_Print(-2,"\t-h    : print the command usage\n");
  }
  else {
    Abc_NtkFraigStoreClean();
  }
  return (uint)(iVar1 != -1);
}

Assistant:

int Abc_CommandFraigClean( Abc_Frame_t * pAbc, int argc, char ** argv )
{
//    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fDuplicate;
    // set defaults
    fDuplicate = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "dh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'd':
            fDuplicate ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    Abc_NtkFraigStoreClean();
    return 0;

usage:
    Abc_Print( -2, "usage: fraig_clean [-h]\n" );
    Abc_Print( -2, "\t        cleans the internal FRAIG storage\n" );
//    Abc_Print( -2, "\t-d    : toggle duplication of logic [default = %s]\n", fDuplicate? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}